

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

void ImGui::SetColumnWidth(int column_index,float width)

{
  ImGuiColumnsSet *pIVar1;
  int iVar2;
  
  if (column_index < 0) {
    column_index = ((GImGui->CurrentWindow->DC).ColumnsSet)->Current;
  }
  pIVar1 = (GImGui->CurrentWindow->DC).ColumnsSet;
  iVar2 = column_index;
  if (column_index < 0) {
    iVar2 = pIVar1->Current;
  }
  SetColumnOffset(column_index + 1,
                  (pIVar1->MaxX - pIVar1->MinX) * (pIVar1->Columns).Data[iVar2].OffsetNorm +
                  pIVar1->MinX + width);
  return;
}

Assistant:

inline    ImGuiWindow*  GetCurrentWindowRead()      { ImGuiContext& g = *GImGui; return g.CurrentWindow; }